

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void ui_wrap_text(int width,char *input,int *output_count,char ***output)

{
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t __n;
  bool local_5a;
  char *outbuf;
  size_t outsize;
  int local_40;
  int outcount;
  int idx;
  int input_lidx;
  int input_idx;
  int len;
  int max_wrap;
  int min_width;
  char ***output_local;
  int *output_count_local;
  char *input_local;
  int width_local;
  
  sVar2 = strlen(input);
  ppcVar3 = (char **)malloc(0xa0);
  *output = ppcVar3;
  for (local_40 = 0; local_40 < 0x14; local_40 = local_40 + 1) {
    (*output)[local_40] = (char *)0x0;
  }
  idx = 0;
  outsize._4_4_ = 0;
  iVar1 = outsize._4_4_;
  do {
    outsize._4_4_ = iVar1;
    if ((int)sVar2 - idx <= width) {
      pcVar4 = strdup(input + idx);
      (*output)[outsize._4_4_] = pcVar4;
      break;
    }
    for (outcount = idx + width; ppuVar5 = __ctype_b_loc(),
        ((*ppuVar5)[(int)(uint)(byte)input[outcount]] & 0x2000) == 0 && 0x14 < outcount - idx;
        outcount = outcount + -1) {
    }
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)(byte)input[outcount]] & 0x2000) == 0) {
      outcount = idx + width;
    }
    __n = (size_t)(outcount - idx);
    pcVar4 = (char *)malloc(__n + 1);
    strncpy(pcVar4,input + idx,__n);
    pcVar4[__n] = '\0';
    (*output)[outsize._4_4_] = pcVar4;
    idx = outcount;
    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)(byte)input[idx]] & 0x2000) != 0) {
      idx = idx + 1;
    }
    local_5a = input[idx] != '\0' && outsize._4_4_ + 1 < 0x14;
    iVar1 = outsize._4_4_ + 1;
  } while (local_5a);
  outsize._4_4_ = outsize._4_4_ + 1;
  *output_count = outsize._4_4_;
  return;
}

Assistant:

void ui_wrap_text(int width, const char *input, int *output_count, char ***output)
{
    const int min_width = 20, max_wrap = 20;

    int len = strlen(input);
    int input_idx, input_lidx;
    int idx, outcount;

    *output = malloc(max_wrap * sizeof(char *));
    for (idx = 0; idx < max_wrap; idx++)
	(*output)[idx] = NULL;

    input_idx = 0;
    outcount = 0;
    do {
	size_t outsize;
	char *outbuf;

	if (len - input_idx <= width) {
	    /* enough room for the rest of the input */
	    (*output)[outcount] = strdup(input + input_idx);
	    outcount++;
	    break;
	}

	/* find nearest space in input to right edge that doesn't exceed width */
	input_lidx = input_idx + width;
	while (!isspace((unsigned char)input[input_lidx]) &&
	       input_lidx - input_idx > min_width)
	    input_lidx--;
	/* didn't find a space, so just go with width-worth of characters */
	if (!isspace((unsigned char)input[input_lidx]))
	    input_lidx = input_idx + width;

	outsize = input_lidx - input_idx;
	outbuf = malloc(outsize + 1);
	strncpy(outbuf, input + input_idx, outsize);
	outbuf[outsize] = '\0';
	(*output)[outcount] = outbuf;
	outcount++;

	/* skip extra spaces in break */
	input_idx = input_lidx;
	while (isspace((unsigned char)input[input_idx]))
	    input_idx++;
    } while (input[input_idx] && outcount < max_wrap);

    *output_count = outcount;
}